

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void __thiscall
FRemapTable::AddColorRange
          (FRemapTable *this,int start,int end,int _r1,int _g1,int _b1,int _r2,int _g2,int _b2)

{
  byte bVar1;
  PalEntry PVar2;
  BYTE BVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar7 = (double)_r1;
  dVar9 = (double)_g1;
  dVar11 = (double)_b1;
  dVar15 = (double)_r2;
  dVar14 = (double)_g2;
  dVar13 = (double)_b2;
  if (end < start) {
    dVar8 = dVar7 - dVar15;
    dVar10 = dVar9 - dVar14;
    dVar12 = dVar11 - dVar13;
    dVar11 = dVar13;
    dVar9 = dVar14;
    dVar7 = dVar15;
    iVar6 = start;
    iVar4 = end;
  }
  else {
    dVar8 = dVar15 - dVar7;
    dVar10 = dVar14 - dVar9;
    dVar12 = dVar13 - dVar11;
    iVar6 = end;
    iVar4 = start;
  }
  if (end == start) {
    bVar1 = GPalette.Remap[iVar4];
    this->Palette[bVar1].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)(bVar1 == 0) * 0x1000000 +
          ((int)dVar11 & 0xffU | ((int)dVar9 & 0xffU) << 8 | ((int)dVar7 & 0xffU) << 0x10) +
         -0x1000000);
    PVar2.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->Palette[bVar1].field_0.d;
    BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)PVar2.field_0 >> 0x10 & 0xff,
                                (uint)PVar2.field_0 >> 8 & 0xff,(uint)PVar2.field_0 & 0xff);
    this->Remap[bVar1] = BVar3;
  }
  else if (iVar4 <= iVar6) {
    dVar13 = 1.0 / (double)(iVar6 - iVar4);
    if (end < start) {
      start = end;
    }
    lVar5 = 0;
    do {
      bVar1 = *(byte *)((long)start + 0x1bfb1a0 + lVar5);
      this->Palette[bVar1].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           ((uint)(bVar1 == 0) * 0x1000000 +
            ((int)dVar11 & 0xffU | ((int)dVar9 & 0xffU) << 8 | ((int)dVar7 & 0xffU) << 0x10) +
           -0x1000000);
      PVar2.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->Palette[bVar1].field_0.d;
      BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)PVar2.field_0 >> 0x10 & 0xff,
                                  (uint)PVar2.field_0 >> 8 & 0xff,(uint)PVar2.field_0 & 0xff);
      this->Remap[bVar1] = BVar3;
      dVar7 = dVar7 + dVar8 * dVar13;
      dVar9 = dVar9 + dVar10 * dVar13;
      dVar11 = dVar11 + dVar12 * dVar13;
      lVar5 = lVar5 + 1;
    } while ((iVar6 - start) + 1 != (int)lVar5);
  }
  return;
}

Assistant:

void FRemapTable::AddColorRange(int start, int end, int _r1,int _g1, int _b1, int _r2, int _g2, int _b2)
{
	double r1 = _r1;
	double g1 = _g1;
	double b1 = _b1;
	double r2 = _r2;
	double g2 = _g2;
	double b2 = _b2;
	double r, g, b;
	double rs, gs, bs;

	if (start > end)
	{
		swapvalues (start, end);
		r = r2;
		g = g2;
		b = b2;
		rs = r1 - r2;
		gs = g1 - g2;
		bs = b1 - b2;
	}
	else
	{
		r = r1;
		g = g1;
		b = b1;
		rs = r2 - r1;
		gs = g2 - g1;
		bs = b2 - b1;
	}
	if (start == end)
	{
		start = GPalette.Remap[start];
		Palette[start] = PalEntry(start == 0 ? 0 : 255, int(r), int(g), int(b));
		Remap[start] = ColorMatcher.Pick(Palette[start]);
	}
	else
	{
		rs /= (end - start);
		gs /= (end - start);
		bs /= (end - start);
		for (int i = start; i <= end; ++i)
		{
			int j = GPalette.Remap[i];
			Palette[j] = PalEntry(j == 0 ? 0 : 255, int(r), int(g), int(b));
			Remap[j] = ColorMatcher.Pick(Palette[j]);
			r += rs;
			g += gs;
			b += bs;
		}
	}
}